

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu2_v2.c
# Opt level: O3

MPP_RET hal_jpege_vepu2_part_wait(void *hal,HalEncTask *task)

{
  long lVar1;
  MPP_RET MVar2;
  MPP_RET MVar3;
  RK_U32 RVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar8 = (ulong)(uint)(*(int *)((long)hal + 0x28) * (task->flags).reg_idx);
  lVar1 = *(long *)((long)hal + 0x20);
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","enter part wait %p\n","hal_jpege_vepu2_part_wait",hal);
  }
  if (*hal == (MppDev)0x0) {
    MVar2 = MPP_OK;
  }
  else {
    MVar3 = mpp_dev_ioctl(*hal,0x10,(void *)0x0);
    MVar2 = MPP_OK;
    if (MVar3 != MPP_OK) {
      _mpp_log_l(2,"hal_jpege_vepu2","poll cmd failed %d\n","hal_jpege_vepu2_part_wait",
                 (ulong)(uint)MVar3);
      MVar2 = MVar3;
    }
  }
  if ((hal_jpege_debug & 4) == 0) {
    uVar5 = *(uint *)(lVar1 + 0xd4 + uVar8);
  }
  else {
    _mpp_log_l(4,"hal_jpege_vepu2","hw_status %08x\n",(char *)0x0,
               (ulong)*(uint *)(lVar1 + 0x1b4 + uVar8));
    uVar5 = *(uint *)(lVar1 + 0xd4 + uVar8);
    if ((hal_jpege_debug & 4) != 0) {
      uVar7 = uVar5 >> 3;
      _mpp_log_l(4,"hal_jpege_vepu2","byte pos %d -> %d\n",(char *)0x0,
                 (ulong)*(uint *)((long)hal + 0x11c),
                 (ulong)((*(uint *)((long)hal + 0x11c) & 0xfffffff8) + uVar7));
      bVar9 = (hal_jpege_debug & 4) == 0;
      goto LAB_0024aaba;
    }
  }
  uVar7 = uVar5 >> 3;
  bVar9 = true;
LAB_0024aaba:
  RVar4 = hal_jpege_debug;
  uVar6 = (*(uint *)((long)hal + 0x11c) & 0xfffffff8) + uVar7;
  *(uint *)((long)hal + 0x11c) = uVar6;
  *(uint *)((long)hal + 0xfc) = uVar6;
  task->length = uVar6;
  task->hw_length = uVar6 - *(int *)((long)hal + 0x150);
  if (!bVar9) {
    _mpp_log_l(4,"hal_jpege_vepu2","stream_length %d, hw_byte %d",(char *)0x0,(ulong)uVar6,
               (ulong)uVar7);
    RVar4 = hal_jpege_debug;
  }
  if ((RVar4 & 0x20) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","stream bit: sw %d hw %d total %d hw_length %d\n",(char *)0x0,
               (ulong)*(uint *)((long)hal + 0x118),(ulong)uVar5,(ulong)*(uint *)((long)hal + 0xfc),
               (ulong)(uint)task->hw_length);
    RVar4 = hal_jpege_debug;
  }
  if ((RVar4 & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","leave part wait %p\n","hal_jpege_vepu2_part_wait",hal);
  }
  return MVar2;
}

Assistant:

MPP_RET hal_jpege_vepu2_part_wait(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalJpegeCtx *ctx = (HalJpegeCtx *)hal;
    RK_S32 reg_idx = task->flags.reg_idx;
    RK_U32 *regs = (RK_U32 *)((RK_U8 *)ctx->regs_out + ctx->reg_size * reg_idx);
    JpegeFeedback *feedback = &ctx->feedback;
    RK_U32 hw_bit = 0;

    hal_jpege_dbg_func("enter part wait %p\n", hal);

    if (ctx->dev) {
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
        if (ret)
            mpp_err_f("poll cmd failed %d\n", ret);
    }

    hal_jpege_dbg_detail("hw_status %08x\n", regs[109]);

    hw_bit = regs[53];

    hal_jpege_dbg_detail("byte pos %d -> %d\n", ctx->part_bytepos,
                         (ctx->part_bytepos & (~7)) + (hw_bit / 8));
    ctx->part_bytepos = (ctx->part_bytepos & (~7)) + (hw_bit / 8);

    feedback->stream_length = ctx->part_bytepos;
    task->length = ctx->part_bytepos;
    task->hw_length = task->length - ctx->hal_start_pos;

    hal_jpege_dbg_detail("stream_length %d, hw_byte %d",
                         feedback->stream_length, hw_bit / 8);

    hal_jpege_dbg_output("stream bit: sw %d hw %d total %d hw_length %d\n",
                         ctx->sw_bit, hw_bit, feedback->stream_length, task->hw_length);

    hal_jpege_dbg_func("leave part wait %p\n", hal);
    return ret;
}